

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void sat_solver_analyze_final(sat_solver *s,int hConf,int skip_first)

{
  clause *pcVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  pcVar1 = Sat_MemClauseHand(&s->Mem,hConf);
  veci_resize(&s->conf_final,0);
  if (s->root_level == 0) {
    return;
  }
  if ((s->tagged).size == 0) {
    uVar3 = extraout_RDX;
    for (uVar5 = (ulong)(skip_first != 0); uVar5 < (uint)*pcVar1 >> 0xb; uVar5 = uVar5 + 1) {
      if (0 < s->levels[(int)pcVar1[uVar5 + 1] >> 1]) {
        var_set_tag(s,(int)pcVar1[uVar5 + 1] >> 1,(int)uVar3);
        uVar3 = extraout_RDX_00;
      }
    }
    if (s->root_level < (s->trail_lim).size) {
      iVar2 = (s->trail_lim).ptr[s->root_level];
    }
    else {
      iVar2 = s->qtail + -1;
    }
    lVar6 = (long)iVar2;
    do {
      if (lVar6 < *(s->trail_lim).ptr) {
        solver2_clear_tags(s,0);
        return;
      }
      iVar2 = s->trail[lVar6] >> 1;
      if (s->tags[iVar2] != '\0') {
        uVar4 = s->reasons[iVar2];
        if (uVar4 == 0) {
          if (s->levels[iVar2] < 1) {
            __assert_fail("var_level(s, x) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x374,"void sat_solver_analyze_final(sat_solver *, int, int)");
          }
          veci_push(&s->conf_final,s->trail[lVar6] ^ 1);
        }
        else if ((uVar4 & 1) == 0) {
          pcVar1 = Sat_MemClauseHand(&s->Mem,uVar4);
          uVar3 = extraout_RDX_01;
          for (uVar5 = 1; uVar5 < (uint)*pcVar1 >> 0xb; uVar5 = uVar5 + 1) {
            if (0 < s->levels[(int)pcVar1[uVar5 + 1] >> 1]) {
              var_set_tag(s,(int)pcVar1[uVar5 + 1] >> 1,(int)uVar3);
              uVar3 = extraout_RDX_02;
            }
          }
        }
        else {
          uVar4 = (int)uVar4 >> 2;
          if (((int)uVar4 < 0) || (s->size <= (int)uVar4)) {
            __assert_fail("lit_var(q) >= 0 && lit_var(q) < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                          ,0x379,"void sat_solver_analyze_final(sat_solver *, int, int)");
          }
          if (0 < s->levels[uVar4]) {
            var_set_tag(s,uVar4,(int)s->reasons);
          }
        }
      }
      lVar6 = lVar6 + -1;
    } while( true );
  }
  __assert_fail("veci_size(&s->tagged) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                ,0x365,"void sat_solver_analyze_final(sat_solver *, int, int)");
}

Assistant:

static void sat_solver_analyze_final(sat_solver* s, int hConf, int skip_first)
{
    clause* conf = clause_read(s, hConf);
    int i, j, start;
    veci_resize(&s->conf_final,0);
    if ( s->root_level == 0 )
        return;
    assert( veci_size(&s->tagged) == 0 );
//    assert( s->tags[lit_var(p)] == l_Undef );
//    s->tags[lit_var(p)] = l_True;
    for (i = skip_first ? 1 : 0; i < clause_size(conf); i++)
    {
        int x = lit_var(clause_begin(conf)[i]);
        if (var_level(s, x) > 0)
            var_set_tag(s, x, 1);
    }

    start = (s->root_level >= veci_size(&s->trail_lim))? s->qtail-1 : (veci_begin(&s->trail_lim))[s->root_level];
    for (i = start; i >= (veci_begin(&s->trail_lim))[0]; i--){
        int x = lit_var(s->trail[i]);
        if (var_tag(s,x)){
            if (s->reasons[x] == 0){
                assert(var_level(s, x) > 0);
                veci_push(&s->conf_final,lit_neg(s->trail[i]));
            }else{
                if (clause_is_lit(s->reasons[x])){
                    lit q = clause_read_lit(s->reasons[x]);
                    assert(lit_var(q) >= 0 && lit_var(q) < s->size);
                    if (var_level(s, lit_var(q)) > 0)
                        var_set_tag(s, lit_var(q), 1);
                }
                else{
                    clause* c = clause_read(s, s->reasons[x]);
                    int* lits = clause_begin(c);
                    for (j = 1; j < clause_size(c); j++)
                        if (var_level(s, lit_var(lits[j])) > 0)
                            var_set_tag(s, lit_var(lits[j]), 1);
                }
            }
        }
    }
    solver2_clear_tags(s,0);
}